

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O2

string * __thiscall helics::InputInfo::getTargets_abi_cxx11_(InputInfo *this)

{
  string *this_00;
  pointer psVar1;
  pointer psVar2;
  string local_50;
  
  this_00 = &this->sourceTargets;
  if ((this->sourceTargets)._M_string_length == 0) {
    psVar2 = (this->source_info).
             super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->source_info).
             super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar2 != psVar1) {
      if ((long)psVar1 - (long)psVar2 == 0x60) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar2);
      }
      else {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,'[');
        psVar1 = (this->source_info).
                 super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (psVar2 = (this->source_info).
                      super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                      ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1;
            psVar2 = psVar2 + 1) {
          generateJsonQuotedString(&local_50,(string *)psVar2);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 &local_50);
          std::__cxx11::string::~string((string *)&local_50);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,','
                   );
        }
        (this->sourceTargets)._M_dataplus._M_p[(this->sourceTargets)._M_string_length - 1] = ']';
      }
    }
  }
  return this_00;
}

Assistant:

const std::string& InputInfo::getTargets() const
{
    if (sourceTargets.empty()) {
        if (!source_info.empty()) {
            if (source_info.size() == 1) {
                sourceTargets = source_info.front().key;
            } else {
                sourceTargets.push_back('[');
                for (const auto& src : source_info) {
                    sourceTargets.append(generateJsonQuotedString(src.key));
                    sourceTargets.push_back(',');
                }
                sourceTargets.back() = ']';
            }
        }
    }
    return sourceTargets;
}